

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimMST.h
# Opt level: O0

double __thiscall PrimMST<BinaryHeap,_false>::operator()(PrimMST<BinaryHeap,_false> *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  size_type sVar3;
  void *pvVar4;
  type pdVar5;
  const_reference pvVar6;
  type pbVar7;
  reference pvVar8;
  vector<Point2d,_std::allocator<Point2d>_> *in_RDI;
  ulong uVar9;
  Point2d PVar10;
  int i;
  double chkMin;
  type_conflict1 *id;
  type_conflict *cur;
  double ans;
  unique_ptr<double[],_std::default_delete<double[]>_> dis;
  unique_ptr<bool[],_std::default_delete<bool[]>_> vis;
  Heap heap;
  int n;
  Point2d *in_stack_fffffffffffffe88;
  double dVar11;
  priority_queue<std::pair<double,_int>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::greater<std::pair<double,_int>_>_>
  *in_stack_fffffffffffffe90;
  undefined1 *in_stack_fffffffffffffe98;
  priority_queue<std::pair<double,_int>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::greater<std::pair<double,_int>_>_>
  *in_stack_fffffffffffffea0;
  value_type *in_stack_fffffffffffffea8;
  priority_queue<std::pair<double,_int>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::greater<std::pair<double,_int>_>_>
  *in_stack_fffffffffffffeb0;
  pair<double,_int> local_e8;
  double local_d8;
  double dStack_d0;
  priority_queue<std::pair<double,_int>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::greater<std::pair<double,_int>_>_>
  *local_c8;
  value_type *local_c0;
  int local_b4;
  priority_queue<std::pair<double,_int>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::greater<std::pair<double,_int>_>_>
  *local_b0;
  int *local_a8;
  double *local_a0;
  double local_98;
  undefined8 uStack_90;
  int local_7c;
  double local_78;
  pair<double,_int> local_70;
  double local_60;
  double local_58;
  undefined1 local_50 [68];
  int local_c;
  
  sVar3 = std::vector<Point2d,_std::allocator<Point2d>_>::size(in_RDI);
  local_c = (int)sVar3;
  std::
  priority_queue<std::pair<double,int>,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>,std::greater<std::pair<double,int>>>
  ::priority_queue<std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>,void>
            (in_stack_fffffffffffffe90);
  uVar9 = (ulong)local_c;
  pvVar4 = operator_new__(uVar9);
  memset(pvVar4,0,uVar9);
  std::unique_ptr<bool[],std::default_delete<bool[]>>::
  unique_ptr<bool*,std::default_delete<bool[]>,void,bool>
            ((unique_ptr<bool[],_std::default_delete<bool[]>_> *)in_stack_fffffffffffffe90,
             (bool *)in_stack_fffffffffffffe88);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)local_c;
  uVar9 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  pvVar4 = operator_new__(uVar9);
  memset(pvVar4,0,uVar9);
  std::unique_ptr<double[],std::default_delete<double[]>>::
  unique_ptr<double*,std::default_delete<double[]>,void,bool>
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)in_stack_fffffffffffffe90,
             &in_stack_fffffffffffffe88->x);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::get
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)in_stack_fffffffffffffe90);
  std::unique_ptr<double[],_std::default_delete<double[]>_>::get
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)in_stack_fffffffffffffe90);
  local_58 = std::numeric_limits<double>::max();
  std::fill<double*,double>
            ((double *)in_stack_fffffffffffffe90,&in_stack_fffffffffffffe88->x,(double *)0x11cda6);
  local_60 = 0.0;
  pdVar5 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                     ((unique_ptr<double[],_std::default_delete<double[]>_> *)
                      in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88);
  *pdVar5 = 0.0;
  local_78 = 0.0;
  local_7c = 0;
  std::pair<double,_int>::pair<double,_int,_true>(&local_70,&local_78,&local_7c);
  std::
  priority_queue<std::pair<double,_int>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::greater<std::pair<double,_int>_>_>
  ::push(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  while (bVar2 = std::
                 priority_queue<std::pair<double,_int>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::greater<std::pair<double,_int>_>_>
                 ::empty((priority_queue<std::pair<double,_int>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::greater<std::pair<double,_int>_>_>
                          *)0x11ce28), ((bVar2 ^ 0xffU) & 1) != 0) {
    pvVar6 = std::
             priority_queue<std::pair<double,_int>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::greater<std::pair<double,_int>_>_>
             ::top((priority_queue<std::pair<double,_int>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::greater<std::pair<double,_int>_>_>
                    *)0x11ce4a);
    local_98 = pvVar6->first;
    uStack_90 = *(undefined8 *)&pvVar6->second;
    local_a0 = std::get<0ul,double,int>((pair<double,_int> *)0x11ce73);
    local_a8 = std::get<1ul,double,int>((pair<double,_int> *)0x11ce85);
    std::
    priority_queue<std::pair<double,_int>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::greater<std::pair<double,_int>_>_>
    ::pop(in_stack_fffffffffffffea0);
    pbVar7 = std::unique_ptr<bool[],_std::default_delete<bool[]>_>::operator[]
                       ((unique_ptr<bool[],_std::default_delete<bool[]>_> *)
                        in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88);
    if ((*pbVar7 & 1U) == 0) {
      pbVar7 = std::unique_ptr<bool[],_std::default_delete<bool[]>_>::operator[]
                         ((unique_ptr<bool[],_std::default_delete<bool[]>_> *)
                          in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88);
      *pbVar7 = true;
      local_60 = *local_a0 + local_60;
      for (local_b4 = 0; local_b4 < local_c; local_b4 = local_b4 + 1) {
        pbVar7 = std::unique_ptr<bool[],_std::default_delete<bool[]>_>::operator[]
                           ((unique_ptr<bool[],_std::default_delete<bool[]>_> *)
                            in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88);
        bVar2 = false;
        if ((*pbVar7 & 1U) == 0) {
          pvVar8 = std::vector<Point2d,_std::allocator<Point2d>_>::operator[]
                             (in_RDI,(long)*local_a8);
          local_d8 = pvVar8->x;
          dStack_d0 = pvVar8->y;
          std::vector<Point2d,_std::allocator<Point2d>_>::operator[](in_RDI,(long)local_b4);
          PVar10.y = (double)in_stack_fffffffffffffe98;
          PVar10.x = (double)in_stack_fffffffffffffe90;
          PVar10 = operator-(PVar10,in_stack_fffffffffffffe88);
          in_stack_fffffffffffffea8 = (value_type *)PVar10.y;
          in_stack_fffffffffffffeb0 =
               (priority_queue<std::pair<double,_int>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::greater<std::pair<double,_int>_>_>
                *)PVar10.x;
          local_c8 = in_stack_fffffffffffffeb0;
          local_c0 = in_stack_fffffffffffffea8;
          in_stack_fffffffffffffea0 =
               (priority_queue<std::pair<double,_int>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::greater<std::pair<double,_int>_>_>
                *)Point2d::length((Point2d *)0x11d01a);
          local_b0 = in_stack_fffffffffffffea0;
          pdVar5 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                             ((unique_ptr<double[],_std::default_delete<double[]>_> *)
                              in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88);
          bVar2 = (double)in_stack_fffffffffffffea0 < *pdVar5;
        }
        if (bVar2) {
          in_stack_fffffffffffffe98 = local_50;
          in_stack_fffffffffffffe90 = local_b0;
          pdVar5 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                             ((unique_ptr<double[],_std::default_delete<double[]>_> *)local_b0,
                              (size_t)in_stack_fffffffffffffe88);
          *pdVar5 = (double)in_stack_fffffffffffffe90;
          pdVar5 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                             ((unique_ptr<double[],_std::default_delete<double[]>_> *)
                              in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88);
          std::pair<double,_int>::pair<double_&,_int_&,_true>(&local_e8,pdVar5,&local_b4);
          std::
          priority_queue<std::pair<double,_int>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::greater<std::pair<double,_int>_>_>
          ::push(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
        }
      }
    }
  }
  dVar11 = local_60;
  std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
            ((unique_ptr<double[],_std::default_delete<double[]>_> *)in_stack_fffffffffffffe90);
  std::unique_ptr<bool[],_std::default_delete<bool[]>_>::~unique_ptr
            ((unique_ptr<bool[],_std::default_delete<bool[]>_> *)in_stack_fffffffffffffe90);
  std::
  priority_queue<std::pair<double,_int>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::greater<std::pair<double,_int>_>_>
  ::~priority_queue((priority_queue<std::pair<double,_int>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::greater<std::pair<double,_int>_>_>
                     *)0x11d127);
  return dVar11;
}

Assistant:

double operator()()
	{
		const int n = static_cast<int>(pts.size());
		Heap heap;
		std::unique_ptr<bool[]> vis(new bool[n]{});
		std::unique_ptr<double[]> dis(new double[n]{});
		std::fill(dis.get(), dis.get() + n, std::numeric_limits<double>::max());
		double ans = 0;
		dis[0] = 0.0, heap.push({0.0, 0});
		while (!heap.empty())
		{
			auto[cur, id] = heap.top();
			heap.pop();
			double chkMin;
			if (vis[id])
				continue;
			vis[id] = true;
			ans += cur;
			for (int i = 0; i < n; ++i)
				if (!vis[i] && (chkMin = (pts[id] - pts[i]).length()) < dis[i])
				{
					dis[i] = chkMin;
					heap.push({dis[i], i});
				}
		}
		return ans;
	}